

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall embree::SceneGraph::HairSetNode::compact_vertices(HairSetNode *this)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in;
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 *puVar3;
  uint uVar4;
  size_t sVar5;
  undefined8 uVar6;
  pointer pvVar7;
  bool bVar8;
  Vec3fx *pVVar9;
  Vec3fx *pVVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pHVar17;
  uint uVar18;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *v;
  ulong uVar19;
  pointer pvVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  positions_o;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_b8;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  long local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  ulong local_50;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_48;
  
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector(&local_b8,
           (long)(this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_48);
  local_48.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 8;
    uVar19 = 0;
    do {
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::reserve(&local_b8,
                *(size_type *)
                 (&(local_48.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar12));
      uVar19 = uVar19 + 1;
      local_48.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      lVar12 = lVar12 + 0x20;
    } while (uVar19 < (ulong)((long)local_48.
                                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pHVar17 = (this->hairs).
            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar17) {
    in = &this->positions;
    uVar19 = 0;
    do {
      uVar4 = pHVar17[uVar19].vertex;
      uVar13 = (ulong)uVar4;
      sVar5 = (local_b8.
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->size_active;
      bVar8 = test_location(in,uVar13,&local_b8,sVar5 - 1);
      uVar18 = (uint)sVar5;
      local_50 = uVar19;
      if (bVar8) {
        pHVar17[uVar19].vertex = uVar18 - 1;
        local_48.
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (this->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (this->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (local_48.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_48.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_80 = (ulong)(uVar4 + 2) << 4;
          uVar19 = 0;
          do {
            pvVar7 = local_b8.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pVVar9 = local_48.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].items + (uVar4 + 1);
            fVar22 = (pVVar9->field_0).m128[2];
            fVar24 = (pVVar9->field_0).m128[3];
            sVar5 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
            uVar11 = local_b8.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
            uVar13 = sVar5 + 1;
            uVar16 = uVar19;
            fVar21 = (pVVar9->field_0).m128[0];
            fVar23 = (pVVar9->field_0).m128[1];
            if (uVar11 < uVar13) {
              uVar14 = uVar13;
              uVar15 = uVar11;
              if (uVar11 != 0) {
                do {
                  uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                  uVar15 = uVar14;
                } while (uVar14 < uVar13);
              }
              if (uVar11 != uVar14) {
                pVVar10 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                local_98 = uVar19;
                local_68 = *(long *)&pVVar9->field_0;
                fStack_60 = fVar22;
                fStack_5c = fVar24;
                pVVar9 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                pvVar7[uVar19].items = pVVar9;
                if (pvVar7[uVar19].size_active != 0) {
                  lVar12 = 0;
                  uVar11 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar10->field_0 + lVar12);
                    uVar6 = puVar3[1];
                    puVar1 = (undefined8 *)((long)&(pvVar7[uVar19].items)->field_0 + lVar12);
                    *puVar1 = *puVar3;
                    puVar1[1] = uVar6;
                    uVar11 = uVar11 + 1;
                    lVar12 = lVar12 + 0x10;
                  } while (uVar11 < pvVar7[uVar19].size_active);
                }
                alignedFree(pVVar10);
                pvVar7[uVar19].size_active = sVar5;
                pvVar7[uVar19].size_alloced = uVar14;
                uVar16 = local_98;
                fVar21 = (float)local_68;
                fVar23 = local_68._4_4_;
                fVar22 = fStack_60;
                fVar24 = fStack_5c;
              }
            }
            pvVar20 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar7[uVar19].size_active = uVar13;
            pVVar9 = pvVar7[uVar19].items + sVar5;
            (pVVar9->field_0).m128[0] = fVar21;
            (pVVar9->field_0).m128[1] = fVar23;
            (pVVar9->field_0).m128[2] = fVar22;
            (pVVar9->field_0).m128[3] = fVar24;
            pfVar2 = (float *)((long)&((in->
                                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar19].items)->
                                      field_0 + local_80);
            fVar22 = pfVar2[2];
            fVar24 = pfVar2[3];
            sVar5 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
            uVar11 = local_b8.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
            uVar13 = sVar5 + 1;
            fVar21 = *pfVar2;
            fVar23 = pfVar2[1];
            if (uVar11 < uVar13) {
              uVar14 = uVar13;
              uVar15 = uVar11;
              if (uVar11 != 0) {
                do {
                  uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                  uVar15 = uVar14;
                } while (uVar14 < uVar13);
              }
              if (uVar11 != uVar14) {
                pVVar9 = local_b8.
                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                local_98 = uVar16;
                local_68 = *(long *)pfVar2;
                fStack_60 = fVar22;
                fStack_5c = fVar24;
                pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                pvVar20[uVar19].items = pVVar10;
                if (pvVar20[uVar19].size_active != 0) {
                  lVar12 = 0;
                  uVar11 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
                    uVar6 = puVar3[1];
                    puVar1 = (undefined8 *)((long)&(pvVar20[uVar19].items)->field_0 + lVar12);
                    *puVar1 = *puVar3;
                    puVar1[1] = uVar6;
                    uVar11 = uVar11 + 1;
                    lVar12 = lVar12 + 0x10;
                  } while (uVar11 < pvVar20[uVar19].size_active);
                }
                alignedFree(pVVar9);
                pvVar20[uVar19].size_active = sVar5;
                pvVar20[uVar19].size_alloced = uVar14;
                uVar16 = local_98;
                fVar21 = (float)local_68;
                fVar23 = local_68._4_4_;
                fVar22 = fStack_60;
                fVar24 = fStack_5c;
              }
            }
            pvVar7 = local_b8.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar20[uVar19].size_active = uVar13;
            pVVar9 = pvVar20[uVar19].items + sVar5;
            (pVVar9->field_0).m128[0] = fVar21;
            (pVVar9->field_0).m128[1] = fVar23;
            (pVVar9->field_0).m128[2] = fVar22;
            (pVVar9->field_0).m128[3] = fVar24;
            pVVar9 = (in->
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar19].items + (uVar4 + 3);
            fVar22 = (pVVar9->field_0).m128[2];
            fVar24 = (pVVar9->field_0).m128[3];
            sVar5 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
            uVar11 = local_b8.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
            uVar13 = sVar5 + 1;
            fVar21 = (pVVar9->field_0).m128[0];
            fVar23 = (pVVar9->field_0).m128[1];
            if (uVar11 < uVar13) {
              uVar14 = uVar13;
              uVar15 = uVar11;
              if (uVar11 != 0) {
                do {
                  uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                  uVar15 = uVar14;
                } while (uVar14 < uVar13);
              }
              if (uVar11 != uVar14) {
                pVVar10 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                local_98 = *(ulong *)&pVVar9->field_0;
                fStack_90 = fVar22;
                fStack_8c = fVar24;
                pVVar9 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                pvVar7[uVar19].items = pVVar9;
                if (pvVar7[uVar19].size_active != 0) {
                  lVar12 = 0;
                  uVar11 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar10->field_0 + lVar12);
                    uVar6 = puVar3[1];
                    puVar1 = (undefined8 *)((long)&(pvVar7[uVar19].items)->field_0 + lVar12);
                    *puVar1 = *puVar3;
                    puVar1[1] = uVar6;
                    uVar11 = uVar11 + 1;
                    lVar12 = lVar12 + 0x10;
                  } while (uVar11 < pvVar7[uVar19].size_active);
                }
                alignedFree(pVVar10);
                pvVar7[uVar19].size_active = sVar5;
                pvVar7[uVar19].size_alloced = uVar14;
                fVar21 = (float)local_98;
                fVar23 = local_98._4_4_;
                fVar22 = fStack_90;
                fVar24 = fStack_8c;
              }
            }
            pvVar7[uVar19].size_active = uVar13;
            pVVar9 = pvVar7[uVar19].items + sVar5;
            (pVVar9->field_0).m128[0] = fVar21;
            (pVVar9->field_0).m128[1] = fVar23;
            (pVVar9->field_0).m128[2] = fVar22;
            (pVVar9->field_0).m128[3] = fVar24;
            uVar19 = uVar16 + 1;
            local_48.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_48.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          } while (uVar19 < (ulong)((long)local_48.
                                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_48.
                                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
      }
      else {
        bVar8 = test_location(in,uVar13,&local_b8,sVar5 - 3);
        if (bVar8) {
          pHVar17[uVar19].vertex = uVar18 - 3;
          local_48.
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_48.
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar19 = 0;
            do {
              pvVar7 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pVVar9 = local_48.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].items + (uVar4 + 3);
              fVar22 = (pVVar9->field_0).m128[0];
              fVar24 = (pVVar9->field_0).m128[1];
              fVar21 = (pVVar9->field_0).m128[2];
              fVar23 = (pVVar9->field_0).m128[3];
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
              uVar11 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
              uVar13 = sVar5 + 1;
              if (uVar11 < uVar13) {
                uVar16 = uVar13;
                uVar14 = uVar11;
                if (uVar11 != 0) {
                  do {
                    uVar16 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
                    uVar14 = uVar16;
                  } while (uVar16 < uVar13);
                }
                if (uVar11 != uVar16) {
                  pVVar9 = local_b8.
                           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                  pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
                  pvVar7[uVar19].items = pVVar10;
                  if (pvVar7[uVar19].size_active != 0) {
                    lVar12 = 0;
                    uVar11 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)&(pvVar7[uVar19].items)->field_0 + lVar12);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      uVar11 = uVar11 + 1;
                      lVar12 = lVar12 + 0x10;
                    } while (uVar11 < pvVar7[uVar19].size_active);
                  }
                  alignedFree(pVVar9);
                  pvVar7[uVar19].size_active = sVar5;
                  pvVar7[uVar19].size_alloced = uVar16;
                }
              }
              pvVar7[uVar19].size_active = uVar13;
              pVVar9 = pvVar7[uVar19].items + sVar5;
              (pVVar9->field_0).m128[0] = fVar22;
              (pVVar9->field_0).m128[1] = fVar24;
              (pVVar9->field_0).m128[2] = fVar21;
              (pVVar9->field_0).m128[3] = fVar23;
              uVar19 = uVar19 + 1;
              local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            } while (uVar19 < (ulong)((long)local_48.
                                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_48.
                                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
        else {
          pHVar17[uVar19].vertex = uVar18;
          local_48.
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_48.
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_80 = (ulong)(uVar4 + 1) << 4;
            local_98 = (ulong)(uVar4 + 2) << 4;
            local_68 = (ulong)(uVar4 + 3) << 4;
            uVar19 = 0;
            do {
              pvVar7 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pVVar9 = local_48.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].items + uVar13;
              fVar22 = (pVVar9->field_0).m128[0];
              fVar24 = (pVVar9->field_0).m128[1];
              fVar21 = (pVVar9->field_0).m128[2];
              fVar23 = (pVVar9->field_0).m128[3];
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
              uVar16 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
              uVar11 = sVar5 + 1;
              if (uVar16 < uVar11) {
                uVar14 = uVar11;
                uVar15 = uVar16;
                if (uVar16 != 0) {
                  do {
                    uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                    uVar15 = uVar14;
                  } while (uVar14 < uVar11);
                }
                if (uVar16 != uVar14) {
                  pVVar9 = local_b8.
                           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                  local_78 = fVar22;
                  fStack_74 = fVar24;
                  fStack_70 = fVar21;
                  fStack_6c = fVar23;
                  pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                  pvVar7[uVar19].items = pVVar10;
                  if (pvVar7[uVar19].size_active != 0) {
                    lVar12 = 0;
                    uVar16 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)&(pvVar7[uVar19].items)->field_0 + lVar12);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      uVar16 = uVar16 + 1;
                      lVar12 = lVar12 + 0x10;
                    } while (uVar16 < pvVar7[uVar19].size_active);
                  }
                  alignedFree(pVVar9);
                  pvVar7[uVar19].size_active = sVar5;
                  pvVar7[uVar19].size_alloced = uVar14;
                  fVar22 = local_78;
                  fVar24 = fStack_74;
                  fVar21 = fStack_70;
                  fVar23 = fStack_6c;
                }
              }
              pvVar20 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar7[uVar19].size_active = uVar11;
              pVVar9 = pvVar7[uVar19].items + sVar5;
              (pVVar9->field_0).m128[0] = fVar22;
              (pVVar9->field_0).m128[1] = fVar24;
              (pVVar9->field_0).m128[2] = fVar21;
              (pVVar9->field_0).m128[3] = fVar23;
              pfVar2 = (float *)((long)&((in->
                                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar19].items)->
                                        field_0 + local_80);
              fVar22 = *pfVar2;
              fVar24 = pfVar2[1];
              fVar21 = pfVar2[2];
              fVar23 = pfVar2[3];
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
              uVar16 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
              uVar11 = sVar5 + 1;
              if (uVar16 < uVar11) {
                uVar14 = uVar11;
                uVar15 = uVar16;
                if (uVar16 != 0) {
                  do {
                    uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                    uVar15 = uVar14;
                  } while (uVar14 < uVar11);
                }
                if (uVar16 != uVar14) {
                  pVVar9 = local_b8.
                           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                  local_78 = fVar22;
                  fStack_74 = fVar24;
                  fStack_70 = fVar21;
                  fStack_6c = fVar23;
                  pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                  pvVar20[uVar19].items = pVVar10;
                  if (pvVar20[uVar19].size_active != 0) {
                    lVar12 = 0;
                    uVar16 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)&(pvVar20[uVar19].items)->field_0 + lVar12);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      uVar16 = uVar16 + 1;
                      lVar12 = lVar12 + 0x10;
                    } while (uVar16 < pvVar20[uVar19].size_active);
                  }
                  alignedFree(pVVar9);
                  pvVar20[uVar19].size_active = sVar5;
                  pvVar20[uVar19].size_alloced = uVar14;
                  fVar22 = local_78;
                  fVar24 = fStack_74;
                  fVar21 = fStack_70;
                  fVar23 = fStack_6c;
                }
              }
              pvVar7 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar20[uVar19].size_active = uVar11;
              pVVar9 = pvVar20[uVar19].items + sVar5;
              (pVVar9->field_0).m128[0] = fVar22;
              (pVVar9->field_0).m128[1] = fVar24;
              (pVVar9->field_0).m128[2] = fVar21;
              (pVVar9->field_0).m128[3] = fVar23;
              pfVar2 = (float *)((long)&((in->
                                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar19].items)->
                                        field_0 + local_98);
              fVar22 = *pfVar2;
              fVar24 = pfVar2[1];
              fVar21 = pfVar2[2];
              fVar23 = pfVar2[3];
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
              uVar16 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
              uVar11 = sVar5 + 1;
              if (uVar16 < uVar11) {
                uVar14 = uVar11;
                uVar15 = uVar16;
                if (uVar16 != 0) {
                  do {
                    uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                    uVar15 = uVar14;
                  } while (uVar14 < uVar11);
                }
                if (uVar16 != uVar14) {
                  pVVar9 = local_b8.
                           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                  local_78 = fVar22;
                  fStack_74 = fVar24;
                  fStack_70 = fVar21;
                  fStack_6c = fVar23;
                  pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                  pvVar7[uVar19].items = pVVar10;
                  if (pvVar7[uVar19].size_active != 0) {
                    lVar12 = 0;
                    uVar16 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)&(pvVar7[uVar19].items)->field_0 + lVar12);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      uVar16 = uVar16 + 1;
                      lVar12 = lVar12 + 0x10;
                    } while (uVar16 < pvVar7[uVar19].size_active);
                  }
                  alignedFree(pVVar9);
                  pvVar7[uVar19].size_active = sVar5;
                  pvVar7[uVar19].size_alloced = uVar14;
                  fVar22 = local_78;
                  fVar24 = fStack_74;
                  fVar21 = fStack_70;
                  fVar23 = fStack_6c;
                }
              }
              pvVar20 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar7[uVar19].size_active = uVar11;
              pVVar9 = pvVar7[uVar19].items + sVar5;
              (pVVar9->field_0).m128[0] = fVar22;
              (pVVar9->field_0).m128[1] = fVar24;
              (pVVar9->field_0).m128[2] = fVar21;
              (pVVar9->field_0).m128[3] = fVar23;
              pfVar2 = (float *)((long)&((in->
                                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar19].items)->
                                        field_0 + local_68);
              fVar22 = *pfVar2;
              fVar24 = pfVar2[1];
              fVar21 = pfVar2[2];
              fVar23 = pfVar2[3];
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].size_active;
              uVar16 = local_b8.
                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].size_alloced;
              uVar11 = sVar5 + 1;
              if (uVar16 < uVar11) {
                uVar14 = uVar11;
                uVar15 = uVar16;
                if (uVar16 != 0) {
                  do {
                    uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
                    uVar15 = uVar14;
                  } while (uVar14 < uVar11);
                }
                if (uVar16 != uVar14) {
                  pVVar9 = local_b8.
                           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].items;
                  pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
                  pvVar20[uVar19].items = pVVar10;
                  if (pvVar20[uVar19].size_active != 0) {
                    lVar12 = 0;
                    uVar16 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)&(pvVar20[uVar19].items)->field_0 + lVar12);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      uVar16 = uVar16 + 1;
                      lVar12 = lVar12 + 0x10;
                    } while (uVar16 < pvVar20[uVar19].size_active);
                  }
                  alignedFree(pVVar9);
                  pvVar20[uVar19].size_active = sVar5;
                  pvVar20[uVar19].size_alloced = uVar14;
                }
              }
              pvVar20[uVar19].size_active = uVar11;
              pVVar9 = pvVar20[uVar19].items + sVar5;
              (pVVar9->field_0).m128[0] = fVar22;
              (pVVar9->field_0).m128[1] = fVar24;
              (pVVar9->field_0).m128[2] = fVar21;
              (pVVar9->field_0).m128[3] = fVar23;
              uVar19 = uVar19 + 1;
              local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_48.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            } while (uVar19 < (ulong)((long)local_48.
                                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_48.
                                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
      }
      uVar19 = local_50 + 1;
      pHVar17 = (this->hairs).
                super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(this->hairs).
                                    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar17 >> 3)
            );
  }
  pvVar7 = local_b8.
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar20 = local_b8.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_b8.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      sVar5 = pvVar20->size_active;
      if (pvVar20->size_alloced != sVar5) {
        pVVar9 = pvVar20->items;
        pVVar10 = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
        pvVar20->items = pVVar10;
        if (pvVar20->size_active != 0) {
          lVar12 = 0;
          uVar19 = 0;
          do {
            puVar1 = (undefined8 *)((long)&pVVar9->field_0 + lVar12);
            uVar6 = puVar1[1];
            puVar3 = (undefined8 *)((long)&pvVar20->items->field_0 + lVar12);
            *puVar3 = *puVar1;
            puVar3[1] = uVar6;
            uVar19 = uVar19 + 1;
            lVar12 = lVar12 + 0x10;
          } while (uVar19 < pvVar20->size_active);
        }
        alignedFree(pVVar9);
        pvVar20->size_active = sVar5;
        pvVar20->size_alloced = sVar5;
      }
      pvVar20 = pvVar20 + 1;
    } while (pvVar20 != pvVar7);
    local_48.
    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_48.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::~vector(&local_48);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void SceneGraph::HairSetNode::compact_vertices()
  {
    std::vector<avector<Vec3ff>> positions_o(positions.size());
    for (size_t i=0; i<positions.size(); i++)
      positions_o.reserve(positions[i].size());
    
    for (size_t i=0; i<hairs.size(); i++) 
    {
      unsigned idx = hairs[i].vertex;
      if (test_location(positions,idx,positions_o,positions_o[0].size()-1)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-1;
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }

      else if (test_location(positions,idx,positions_o,positions_o[0].size()-3)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-3;
        for (size_t k=0; k<positions.size(); k++)
          positions_o[k].push_back(positions[k][idx+3]);
      }

      else
      {
        hairs[i].vertex = (unsigned) positions_o[0].size();
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+0]);
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }
    }

    for (auto& v : positions_o)
      v.shrink_to_fit();
   
    positions = std::move(positions_o);
  }